

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b88.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinB88>::eval_exc_polar_impl
               (double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
               double *eps)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  undefined4 in_XMM4_Da;
  undefined4 in_XMM4_Db;
  double t93;
  double t89;
  double t84;
  double t83;
  double t80;
  double t79;
  double t78;
  double t76;
  double t75;
  double t73;
  double t72;
  double t71;
  double t70;
  double t69;
  double t68;
  double t66;
  double t65;
  double t64;
  double t63;
  double t61;
  double t60;
  double t59;
  double t55;
  double t50;
  double t49;
  double t46;
  double t45;
  double t44;
  double t42;
  double t40;
  double t38;
  double t37;
  double t36;
  double t35;
  double t27;
  double t26;
  double t25;
  double t23;
  double t22;
  double t21;
  double t20;
  double t19;
  double t18;
  double t16;
  double t15;
  double t14;
  double t11;
  double t10;
  double t7;
  double t6;
  double t1;
  double t41;
  double t33;
  double t32;
  double t29;
  double t28;
  double t5;
  double t34;
  double t31;
  double t3;
  double t2;
  
  dVar1 = 1.0 / (in_XMM0_Qa + in_XMM1_Qa);
  dVar2 = (double)(-(ulong)((in_XMM0_Qa + in_XMM0_Qa) * dVar1 <= 1e-15) & 0x3ff0000000000000);
  dVar3 = (double)(-(ulong)((in_XMM1_Qa + in_XMM1_Qa) * dVar1 <= 1e-15) & 0x3ff0000000000000);
  dVar4 = piecewise_functor_5<double>
                    ((bool)(-(dVar2 != 0.0) & 1),-0.999999999999999,(bool)(-(dVar3 != 0.0) & 1),
                     0.999999999999999,(in_XMM0_Qa - in_XMM1_Qa) * dVar1);
  dVar5 = safe_math::cbrt<double>(9.29904173123165e-318);
  dVar6 = safe_math::cbrt<double>(9.29929370471103e-318);
  dVar4 = piecewise_functor_3<double>
                    ((bool)(-((double)(-(ulong)(dVar4 + 1.0 <= 1e-15) & 0x3ff0000000000000) != 0.0)
                           & 1),dVar5 * 1e-15,dVar6 * (dVar4 + 1.0));
  dVar6 = safe_math::cbrt<double>(9.29979271101333e-318);
  dVar7 = safe_math::cbrt<double>(9.30031642059792e-318);
  dVar8 = safe_math::sqrt<double>(9.30075613902272e-318);
  safe_math::sqrt<double>(9.30130949254606e-318);
  dVar9 = safe_math::log<double>(9.30139842436231e-318);
  dVar4 = piecewise_functor_3<double>
                    ((bool)(-((double)(-(ulong)(in_XMM0_Qa <= 1e-25) & 0x3ff0000000000000) != 0.0) &
                           1),0.0,
                     dVar4 * dVar6 * -0.36927938319101117 *
                     (in_XMM2_Qa * 1.5874010519681996 * 0.0028433756331771257 *
                      ((1.0 / (dVar7 * dVar7)) / (in_XMM0_Qa * in_XMM0_Qa)) *
                      (1.0 / (dVar8 * ((1.0 / dVar7) / in_XMM0_Qa) * 0.0252 * dVar9 + 1.0)) + 1.0));
  dVar1 = piecewise_functor_5<double>
                    ((bool)(-(dVar3 != 0.0) & 1),-0.999999999999999,(bool)(-(dVar2 != 0.0) & 1),
                     0.999999999999999,-(in_XMM0_Qa - in_XMM1_Qa) * dVar1);
  dVar2 = safe_math::cbrt<double>(9.3037995834011e-318);
  dVar1 = piecewise_functor_3<double>
                    ((double)(-(ulong)(dVar1 + 1.0 <= 1e-15) & 0x3ff0000000000000) != 0.0,
                     dVar5 * 1e-15,dVar2 * (dVar1 + 1.0));
  dVar2 = safe_math::cbrt<double>(9.30465925762486e-318);
  dVar3 = safe_math::sqrt<double>(9.30507921342383e-318);
  safe_math::sqrt<double>(9.30569679548113e-318);
  dVar5 = safe_math::log<double>(9.30578572729738e-318);
  dVar1 = piecewise_functor_3<double>
                    ((double)(-(ulong)(in_XMM1_Qa <= 1e-25) & 0x3ff0000000000000) != 0.0,0.0,
                     dVar1 * dVar6 * -0.36927938319101117 *
                     ((double)CONCAT44(in_XMM4_Db,in_XMM4_Da) * 1.5874010519681996 *
                      0.0028433756331771257 * ((1.0 / (dVar2 * dVar2)) / (in_XMM1_Qa * in_XMM1_Qa))
                      * (1.0 / (dVar3 * ((1.0 / dVar2) / in_XMM1_Qa) * 0.0252 * dVar5 + 1.0)) + 1.0)
                    );
  *in_RDI = dVar4 + dVar1;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar_impl( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double& eps ) {

    (void)(sigma_ab);
    (void)(eps);
    constexpr double t2 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_pi;
    constexpr double t31 = constants::m_cbrt_one_ov_pi;
    constexpr double t34 = constants::m_cbrt_4;
    constexpr double t5 = t2 / t3;
    constexpr double t28 = t2 * t2;
    constexpr double t29 = beta * t28;
    constexpr double t32 = 0.1e1 / t31;
    constexpr double t33 = t29 * t32;
    constexpr double t41 = gamma * beta;


    const double t1 = rho_a <= dens_tol;
    const double t6 = rho_a + rho_b;
    const double t7 = 0.1e1 / t6;
    const double t10 = 0.2e1 * rho_a * t7 <= zeta_tol;
    const double t11 = zeta_tol - 0.1e1;
    const double t14 = 0.2e1 * rho_b * t7 <= zeta_tol;
    const double t15 = -t11;
    const double t16 = rho_a - rho_b;
    const double t18 = piecewise_functor_5( t10, t11, t14, t15, t16 * t7 );
    const double t19 = 0.1e1 + t18;
    const double t20 = t19 <= zeta_tol;
    const double t21 = safe_math::cbrt( zeta_tol );
    const double t22 = t21 * zeta_tol;
    const double t23 = safe_math::cbrt( t19 );
    const double t25 = piecewise_functor_3( t20, t22, t23 * t19 );
    const double t26 = safe_math::cbrt( t6 );
    const double t27 = t25 * t26;
    const double t35 = t34 * sigma_aa;
    const double t36 = rho_a * rho_a;
    const double t37 = safe_math::cbrt( rho_a );
    const double t38 = t37 * t37;
    const double t40 = 0.1e1 / t38 / t36;
    const double t42 = safe_math::sqrt( sigma_aa );
    const double t44 = 0.1e1 / t37 / rho_a;
    const double t45 = t42 * t44;
    const double t46 = safe_math::log( t45 + safe_math::sqrt( t45 * t45 + 0.1e1 ) );
    const double t49 = t41 * t45 * t46 + 0.1e1;
    const double t50 = 0.1e1 / t49;
    const double t55 = 0.1e1 + 0.2e1 / 0.9e1 * t33 * t35 * t40 * t50;
    const double t59 = piecewise_functor_3( t1, 0.0, -0.3e1 / 0.8e1 * t5 * t27 * t55 );
    const double t60 = rho_b <= dens_tol;
    const double t61 = -t16;
    const double t63 = piecewise_functor_5( t14, t11, t10, t15, t61 * t7 );
    const double t64 = 0.1e1 + t63;
    const double t65 = t64 <= zeta_tol;
    const double t66 = safe_math::cbrt( t64 );
    const double t68 = piecewise_functor_3( t65, t22, t66 * t64 );
    const double t69 = t68 * t26;
    const double t70 = t34 * sigma_bb;
    const double t71 = rho_b * rho_b;
    const double t72 = safe_math::cbrt( rho_b );
    const double t73 = t72 * t72;
    const double t75 = 0.1e1 / t73 / t71;
    const double t76 = safe_math::sqrt( sigma_bb );
    const double t78 = 0.1e1 / t72 / rho_b;
    const double t79 = t76 * t78;
    const double t80 = safe_math::log( t79 + safe_math::sqrt( t79 * t79 + 0.1e1 ) );
    const double t83 = t41 * t79 * t80 + 0.1e1;
    const double t84 = 0.1e1 / t83;
    const double t89 = 0.1e1 + 0.2e1 / 0.9e1 * t33 * t70 * t75 * t84;
    const double t93 = piecewise_functor_3( t60, 0.0, -0.3e1 / 0.8e1 * t5 * t69 * t89 );


    eps = t59 + t93;

  }